

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pclmulqdq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  ulong local_50;
  uint64_t resl;
  uint64_t resh;
  uint64_t b;
  uint64_t al;
  uint64_t ah;
  uint32_t ctrl_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  al = 0;
  b = d->_q_ZMMReg[(int)(uint)((ctrl & 1) != 0)];
  resh = s->_q_ZMMReg[(int)(uint)((ctrl & 0x10) != 0)];
  local_50 = 0;
  resl = 0;
  for (; resh != 0; resh = resh >> 1) {
    if ((resh & 1) != 0) {
      local_50 = b ^ local_50;
      resl = al ^ resl;
    }
    al = al << 1 | b >> 0x3f;
    b = b << 1;
  }
  d->_q_ZMMReg[0] = local_50;
  d->_q_ZMMReg[1] = resl;
  return;
}

Assistant:

void glue(helper_pclmulqdq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    uint64_t ah, al, b, resh, resl;

    ah = 0;
    al = d->Q((ctrl & 1) != 0);
    b = s->Q((ctrl & 16) != 0);
    resh = resl = 0;

    while (b) {
        if (b & 1) {
            resl ^= al;
            resh ^= ah;
        }
        ah = (ah << 1) | (al >> 63);
        al <<= 1;
        b >>= 1;
    }

    d->Q(0) = resl;
    d->Q(1) = resh;
}